

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

void modify_arm_cp_regs_arm(ARMCPRegInfo *regs,ARMCPRegUserSpaceInfo *mods)

{
  gboolean gVar1;
  int iVar2;
  GPatternSpec *pspec;
  uint64_t *puVar3;
  
  do {
    if (mods->name == (gchar *)0x0) {
      return;
    }
    puVar3 = &regs->resetvalue;
    if (mods->is_glob == true) {
      pspec = g_pattern_spec_new(mods->name);
    }
    else {
      pspec = (GPatternSpec *)0x0;
    }
    for (; *(int *)((long)puVar3 + -0x14) != 0xfffff; puVar3 = puVar3 + 0x11) {
      if ((pspec == (GPatternSpec *)0x0) ||
         (gVar1 = g_pattern_match_string(pspec,((ARMCPRegInfo *)(puVar3 + -5))->name), gVar1 == 0))
      {
        iVar2 = strcmp(((ARMCPRegInfo *)(puVar3 + -5))->name,mods->name);
        if (iVar2 == 0) {
          *(undefined8 *)((long)puVar3 + -0x14) = 0xa800000002;
          *puVar3 = *puVar3 & mods->exported_bits | mods->fixed_bits;
          break;
        }
      }
      else {
        *(undefined8 *)((long)puVar3 + -0x14) = 0xa800000002;
        *puVar3 = 0;
      }
    }
    if (pspec != (GPatternSpec *)0x0) {
      g_pattern_spec_free(pspec);
    }
    mods = mods + 1;
  } while( true );
}

Assistant:

void modify_arm_cp_regs(ARMCPRegInfo *regs, const ARMCPRegUserSpaceInfo *mods)
{
    const ARMCPRegUserSpaceInfo *m;
    ARMCPRegInfo *r;

    for (m = mods; m->name; m++) {
        GPatternSpec *pat = NULL;
        if (m->is_glob) {
            pat = g_pattern_spec_new(m->name);
        }
        for (r = regs; r->type != ARM_CP_SENTINEL; r++) {
            if (pat && g_pattern_match_string(pat, r->name)) {
                r->type = ARM_CP_CONST;
                r->access = PL0U_R;
                r->resetvalue = 0;
                /* continue */
            } else if (strcmp(r->name, m->name) == 0) {
                r->type = ARM_CP_CONST;
                r->access = PL0U_R;
                r->resetvalue &= m->exported_bits;
                r->resetvalue |= m->fixed_bits;
                break;
            }
        }
        if (pat) {
            g_pattern_spec_free(pat);
        }
    }
}